

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_tar_ustar.c
# Opt level: O1

void test_write_format_tar_ustar(void)

{
  char cVar1;
  int iVar2;
  undefined4 *buff;
  archive *_a;
  archive_entry *paVar3;
  la_ssize_t lVar4;
  uint uVar5;
  long lVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  size_t used;
  char f99 [100];
  char f100 [101];
  char f256 [257];
  
  cVar1 = 'a';
  uVar5 = 0;
  lVar6 = 0;
  do {
    f99[lVar6] = cVar1 - ((char)(uVar5 / 0x1a) * '\x19' + (char)(uVar5 / 0x1a));
    lVar6 = lVar6 + 1;
    cVar1 = cVar1 + '\x01';
    uVar5 = uVar5 + 1;
  } while (lVar6 != 99);
  f99[99] = '\0';
  cVar1 = 'A';
  uVar5 = 0;
  lVar6 = 0;
  do {
    f100[lVar6] = cVar1 - ((char)(uVar5 / 0x1a) * '\x19' + (char)(uVar5 / 0x1a));
    lVar6 = lVar6 + 1;
    cVar1 = cVar1 + '\x01';
    uVar5 = uVar5 + 1;
  } while (lVar6 != 100);
  f100[100] = '\0';
  cVar1 = 'A';
  uVar5 = 0;
  lVar6 = 0;
  do {
    f256[lVar6] = cVar1 - ((char)(uVar5 / 0x1a) * '\x19' + (char)(uVar5 / 0x1a));
    lVar6 = lVar6 + 1;
    cVar1 = cVar1 + '\x01';
    uVar5 = uVar5 + 1;
  } while (lVar6 != 0x100);
  f256[0x9b] = '/';
  wVar8 = L'\0';
  f256[0x100] = '\0';
  buff = (undefined4 *)malloc(100000);
  _a = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'M',(uint)(_a != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_write_set_format_ustar(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'O',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_ustar(a)",_a);
  iVar2 = archive_write_add_filter_none(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Q',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_none(a)",_a);
  iVar2 = archive_write_open_memory(_a,buff,100000,&used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'S',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_open_memory(a, buff, buffsize, &used)",_a);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'[',(uint)(paVar3 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_set_pathname(paVar3,"file");
  archive_entry_set_mode(paVar3,0x81b4);
  archive_entry_set_size(paVar3,10);
  archive_entry_set_uid(paVar3,0x50);
  archive_entry_set_gid(paVar3,0x5a);
  archive_entry_set_dev(paVar3,0xc);
  archive_entry_set_ino(paVar3,0x59);
  archive_entry_set_nlink(paVar3,2);
  iVar2 = archive_write_header(_a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'f',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar3);
  lVar4 = archive_write_data(_a,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'h',10,"10",lVar4,"archive_write_data(a, \"1234567890\", 10)",_a);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'k',(uint)(paVar3 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_set_pathname(paVar3,"linkfile");
  archive_entry_set_mode(paVar3,0x81b4);
  archive_entry_set_uid(paVar3,0x50);
  archive_entry_set_gid(paVar3,0x5a);
  archive_entry_set_dev(paVar3,0xc);
  archive_entry_set_ino(paVar3,0x59);
  archive_entry_set_nlink(paVar3,2);
  iVar2 = archive_write_header(_a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'w',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar3);
  lVar4 = archive_write_data(_a,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'z',0,"0",lVar4,"archive_write_data(a, \"1234567890\", 10)",_a);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'}',(uint)(paVar3 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,2,0x14);
  archive_entry_set_pathname(paVar3,"dir");
  archive_entry_set_mode(paVar3,0x41fd);
  archive_entry_set_size(paVar3,10);
  archive_entry_set_nlink(paVar3,2);
  iVar2 = archive_write_header(_a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'\x84',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar3);
  lVar4 = archive_write_data(_a,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'\x87',0,"0",lVar4,"archive_write_data(a, \"1234567890\", 10)",_a);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'\x8a',(uint)(paVar3 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,3,0x1e);
  archive_entry_set_pathname(paVar3,"symlink");
  archive_entry_set_mode(paVar3,0x1b4);
  archive_entry_set_filetype(paVar3,0xa000);
  archive_entry_set_symlink(paVar3,"file");
  archive_entry_set_size(paVar3,0);
  archive_entry_set_uid(paVar3,0x58);
  archive_entry_set_gid(paVar3,0x62);
  archive_entry_set_dev(paVar3,0xc);
  archive_entry_set_ino(paVar3,0x5a);
  archive_entry_set_nlink(paVar3,1);
  iVar2 = archive_write_header(_a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'\x97',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar3);
  lVar4 = archive_write_data(_a,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'\x9a',0,"0",lVar4,"archive_write_data(a, \"1234567890\", 10)",_a);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'\x9d',(uint)(paVar3 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_set_pathname(paVar3,f99);
  archive_entry_set_mode(paVar3,0x81b4);
  archive_entry_set_size(paVar3,0);
  archive_entry_set_uid(paVar3,0x52);
  archive_entry_set_gid(paVar3,0x5d);
  archive_entry_set_dev(paVar3,0x66);
  archive_entry_set_ino(paVar3,7);
  archive_entry_set_nlink(paVar3,1);
  iVar2 = archive_write_header(_a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'¨',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'¬',(uint)(paVar3 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_set_pathname(paVar3,f100);
  archive_entry_set_mode(paVar3,0x81b4);
  archive_entry_set_size(paVar3,0);
  archive_entry_set_uid(paVar3,0x52);
  archive_entry_set_gid(paVar3,0x5d);
  archive_entry_set_dev(paVar3,0x66);
  archive_entry_set_ino(paVar3,7);
  archive_entry_set_nlink(paVar3,1);
  iVar2 = archive_write_header(_a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'·',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'»',(uint)(paVar3 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_set_pathname(paVar3,f256);
  archive_entry_set_mode(paVar3,0x81b4);
  archive_entry_set_size(paVar3,0);
  archive_entry_set_uid(paVar3,0x52);
  archive_entry_set_gid(paVar3,0x5d);
  archive_entry_set_dev(paVar3,0x66);
  archive_entry_set_ino(paVar3,7);
  archive_entry_set_nlink(paVar3,1);
  iVar2 = archive_write_header(_a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Æ',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar3);
  iVar2 = archive_write_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ê',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ò',buff,"e + 0","file","\"file\"",5,"5",(void *)0x0);
  *buff = 0;
  *(undefined1 *)(buff + 1) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ó',buff + 0x19,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x19) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ô',buff + 0x1b,"e + 108","000120 ","\"000120 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x1b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Õ',buff + 0x1d,"e + 116","000132 ","\"000132 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x1d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ö',buff + 0x1f,"e + 124","00000000012 ","\"00000000012 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x1f) = 0;
  buff[0x21] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'×',buff + 0x22,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x22) = 0;
  buff[0x24] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ø',buff + 0x25,"e + 148","010034","\"010034\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x25) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ù',buff + 0x27,"e + 156","0","\"0\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x27) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ú',(void *)((long)buff + 0x9d),"e + 157","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x9d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Û',(void *)((long)buff + 0x101),"e + 257","ustar","\"ustar\\000000\"",8,
                      "8",(void *)0x0);
  *(undefined8 *)((long)buff + 0x101) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ü',(void *)((long)buff + 0x109),"e + 265","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x109) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ý',(void *)((long)buff + 0x129),"e + 297","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x129) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Þ',(void *)((long)buff + 0x149),"e + 329","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x149) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ß',(void *)((long)buff + 0x151),"e + 337","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x151) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'à',(void *)((long)buff + 0x159),"e + 345","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x159) = 0;
  lVar6 = 0;
  do {
    if (*(char *)((long)buff + lVar6) != '\0') goto LAB_002007e2;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x200);
  wVar8 = L'\x01';
LAB_002007e2:
  wVar7 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'á',wVar8,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'â',buff + 0x80,"e + 512","1234567890","\"1234567890\"",10,"10",(void *)0x0
                     );
  *(undefined8 *)(buff + 0x80) = 0;
  *(undefined2 *)(buff + 0x82) = 0;
  lVar6 = 0x200;
  do {
    if (*(char *)((long)buff + lVar6) != '\0') goto LAB_0020086f;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x400);
  wVar7 = L'\x01';
LAB_0020086f:
  wVar8 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'ã',wVar7,"is_null(e + 512, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ç',buff + 0x100,"e + 0","linkfile","\"linkfile\"",9,"9",(void *)0x0);
  *(undefined8 *)(buff + 0x100) = 0;
  *(undefined1 *)(buff + 0x102) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'è',buff + 0x119,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x119) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'é',buff + 0x11b,"e + 108","000120 ","\"000120 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x11b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ê',buff + 0x11d,"e + 116","000132 ","\"000132 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x11d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ë',buff + 0x11f,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x11f) = 0;
  buff[0x121] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ì',buff + 0x122,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x122) = 0;
  buff[0x124] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'í',buff + 0x125,"e + 148","010707","\"010707\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x125) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'î',buff + 0x127,"e + 156","0","\"0\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x127) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ï',(void *)((long)buff + 0x49d),"e + 157","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x49d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ð',(void *)((long)buff + 0x501),"e + 257","ustar","\"ustar\\000000\"",8,
                      "8",(void *)0x0);
  *(undefined8 *)((long)buff + 0x501) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ñ',(void *)((long)buff + 0x509),"e + 265","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x509) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ò',(void *)((long)buff + 0x529),"e + 297","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x529) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ó',(void *)((long)buff + 0x549),"e + 329","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x549) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ô',(void *)((long)buff + 0x551),"e + 337","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x551) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'õ',(void *)((long)buff + 0x559),"e + 345","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x559) = 0;
  lVar6 = -0x200;
  do {
    if (*(char *)((long)buff + lVar6 + 0x600) != '\0') goto LAB_00200cc1;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0);
  wVar8 = L'\x01';
LAB_00200cc1:
  wVar7 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'ö',wVar8,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ú',buff + 0x180,"e + 0","dir/","\"dir/\"",4,"4",(void *)0x0);
  buff[0x180] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'û',buff + 0x199,"e + 100","000775 ","\"000775 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x199) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ü',buff + 0x19b,"e + 108","000000 ","\"000000 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x19b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ý',buff + 0x19d,"e + 116","000000 ","\"000000 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x19d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'þ',buff + 0x19f,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x19f) = 0;
  buff[0x1a1] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ÿ',buff + 0x1a2,"e + 136","00000000002 ","\"00000000002 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x1a2) = 0;
  buff[0x1a4] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ā',buff + 0x1a5,"e + 148","007747","\"007747\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x1a5) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ā',buff + 0x1a7,"e + 156","5","\"5\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x1a7) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ă',(void *)((long)buff + 0x69d),"e + 157","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x69d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ă',(void *)((long)buff + 0x701),"e + 257","ustar","\"ustar\\000000\"",8,
                      "8",(void *)0x0);
  *(undefined8 *)((long)buff + 0x701) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ą',(void *)((long)buff + 0x709),"e + 265","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x709) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ą',(void *)((long)buff + 0x729),"e + 297","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x729) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ć',(void *)((long)buff + 0x749),"e + 329","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x749) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ć',(void *)((long)buff + 0x751),"e + 337","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x751) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĉ',(void *)((long)buff + 0x759),"e + 345","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x759) = 0;
  lVar6 = 0x600;
  do {
    if (*(char *)((long)buff + lVar6) != '\0') goto LAB_00201116;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x800);
  wVar7 = L'\x01';
LAB_00201116:
  wVar8 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'ĉ',wVar7,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'č',buff + 0x200,"e + 0","symlink","\"symlink\"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x200) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ď',buff + 0x219,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x219) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ď',buff + 0x21b,"e + 108","000130 ","\"000130 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x21b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Đ',buff + 0x21d,"e + 116","000142 ","\"000142 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x21d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'đ',buff + 0x21f,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x21f) = 0;
  buff[0x221] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ē',buff + 0x222,"e + 136","00000000003 ","\"00000000003 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x222) = 0;
  buff[0x224] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ē',buff + 0x225,"e + 148","011446","\"011446\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x225) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĕ',buff + 0x227,"e + 156","2","\"2\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x227) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĕ',(void *)((long)buff + 0x89d),"e + 157","file","\"file\"",5,"5",
                      (void *)0x0);
  *(undefined4 *)((long)buff + 0x89d) = 0;
  *(undefined1 *)((long)buff + 0x8a1) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ė',(void *)((long)buff + 0x901),"e + 257","ustar","\"ustar\\000000\"",8,
                      "8",(void *)0x0);
  *(undefined8 *)((long)buff + 0x901) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ė',(void *)((long)buff + 0x909),"e + 265","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x909) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ę',(void *)((long)buff + 0x929),"e + 297","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x929) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ę',(void *)((long)buff + 0x949),"e + 329","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x949) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ě',(void *)((long)buff + 0x951),"e + 337","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x951) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ě',(void *)((long)buff + 0x959),"e + 345","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x959) = 0;
  lVar6 = -0x200;
  do {
    if (*(char *)((long)buff + lVar6 + 0xa00) != '\0') goto LAB_00201579;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0);
  wVar8 = L'\x01';
LAB_00201579:
  wVar7 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'Ĝ',wVar8,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ġ',buff + 0x280,"e + 0",f99,"f99",100,"100",(void *)0x0);
  *(undefined8 *)(buff + 0x280) = 0;
  *(undefined8 *)(buff + 0x282) = 0;
  *(undefined8 *)(buff + 0x284) = 0;
  *(undefined8 *)(buff + 0x286) = 0;
  *(undefined8 *)(buff + 0x288) = 0;
  *(undefined8 *)(buff + 0x28a) = 0;
  *(undefined8 *)(buff + 0x28c) = 0;
  *(undefined8 *)(buff + 0x28e) = 0;
  *(undefined8 *)(buff + 0x290) = 0;
  *(undefined8 *)(buff + 0x292) = 0;
  *(undefined8 *)(buff + 0x294) = 0;
  *(undefined8 *)(buff + 0x296) = 0;
  buff[0x298] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ġ',buff + 0x299,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x299) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ģ',buff + 0x29b,"e + 108","000122 ","\"000122 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x29b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ģ',buff + 0x29d,"e + 116","000135 ","\"000135 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x29d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĥ',buff + 0x29f,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x29f) = 0;
  buff[0x2a1] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĥ',buff + 0x2a2,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x2a2) = 0;
  buff[0x2a4] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ħ',buff + 0x2a5,"e + 148","034242","\"034242\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x2a5) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ħ',buff + 0x2a7,"e + 156","0","\"0\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x2a7) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĩ',(void *)((long)buff + 0xa9d),"e + 157","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xa9d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĩ',(void *)((long)buff + 0xb01),"e + 257","ustar","\"ustar\\000000\"",8,
                      "8",(void *)0x0);
  *(undefined8 *)((long)buff + 0xb01) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ī',(void *)((long)buff + 0xb09),"e + 265","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xb09) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ī',(void *)((long)buff + 0xb29),"e + 297","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xb29) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĭ',(void *)((long)buff + 0xb49),"e + 329","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0xb49) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĭ',(void *)((long)buff + 0xb51),"e + 337","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0xb51) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Į',(void *)((long)buff + 0xb59),"e + 345","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xb59) = 0;
  lVar6 = -0x200;
  do {
    if (*(char *)((long)buff + lVar6 + 0xc00) != '\0') goto LAB_002019ef;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0);
  wVar7 = L'\x01';
LAB_002019ef:
  wVar8 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'į',wVar7,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĳ',buff + 0x300,"e + 0",f100,"f100",100,"100",(void *)0x0);
  *(undefined8 *)(buff + 0x300) = 0;
  *(undefined8 *)(buff + 0x302) = 0;
  *(undefined8 *)(buff + 0x304) = 0;
  *(undefined8 *)(buff + 0x306) = 0;
  *(undefined8 *)(buff + 0x308) = 0;
  *(undefined8 *)(buff + 0x30a) = 0;
  *(undefined8 *)(buff + 0x30c) = 0;
  *(undefined8 *)(buff + 0x30e) = 0;
  *(undefined8 *)(buff + 0x310) = 0;
  *(undefined8 *)(buff + 0x312) = 0;
  *(undefined8 *)(buff + 0x314) = 0;
  *(undefined8 *)(buff + 0x316) = 0;
  buff[0x318] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĵ',buff + 0x319,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x319) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĵ',buff + 0x31b,"e + 108","000122 ","\"000122 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x31b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ķ',buff + 0x31d,"e + 116","000135 ","\"000135 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x31d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ķ',buff + 799,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 799) = 0;
  buff[0x321] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĸ',buff + 0x322,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x322) = 0;
  buff[0x324] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĺ',buff + 0x325,"e + 148","026230","\"026230\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x325) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĺ',buff + 0x327,"e + 156","0","\"0\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x327) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ļ',(void *)((long)buff + 0xc9d),"e + 157","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xc9d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ļ',(void *)((long)buff + 0xd01),"e + 257","ustar","\"ustar\\000000\"",8,
                      "8",(void *)0x0);
  *(undefined8 *)((long)buff + 0xd01) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ľ',(void *)((long)buff + 0xd09),"e + 265","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xd09) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ľ',(void *)((long)buff + 0xd29),"e + 297","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xd29) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ŀ',(void *)((long)buff + 0xd49),"e + 329","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0xd49) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ŀ',(void *)((long)buff + 0xd51),"e + 337","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0xd51) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ł',(void *)((long)buff + 0xd59),"e + 345","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xd59) = 0;
  lVar6 = -0x200;
  do {
    if (*(char *)((long)buff + lVar6 + 0xe00) != '\0') goto LAB_00201e68;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0);
  wVar8 = L'\x01';
LAB_00201e68:
  wVar7 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'ł',wVar8,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ņ',buff + 0x380,"e + 0",f256 + 0x9c,"f256 + 156",100,"100",(void *)0x0);
  *(undefined8 *)(buff + 0x380) = 0;
  *(undefined8 *)(buff + 0x382) = 0;
  *(undefined8 *)(buff + 900) = 0;
  *(undefined8 *)(buff + 0x386) = 0;
  *(undefined8 *)(buff + 0x388) = 0;
  *(undefined8 *)(buff + 0x38a) = 0;
  *(undefined8 *)(buff + 0x38c) = 0;
  *(undefined8 *)(buff + 0x38e) = 0;
  *(undefined8 *)(buff + 0x390) = 0;
  *(undefined8 *)(buff + 0x392) = 0;
  *(undefined8 *)(buff + 0x394) = 0;
  *(undefined8 *)(buff + 0x396) = 0;
  buff[0x398] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ň',buff + 0x399,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x399) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ň',buff + 0x39b,"e + 108","000122 ","\"000122 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x39b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ŉ',buff + 0x39d,"e + 116","000135 ","\"000135 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x39d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ŋ',buff + 0x39f,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x39f) = 0;
  buff[0x3a1] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ŋ',buff + 0x3a2,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x3a2) = 0;
  buff[0x3a4] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ō',buff + 0x3a5,"e + 148","055570","\"055570\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x3a5) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ō',buff + 0x3a7,"e + 156","0","\"0\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x3a7) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ŏ',(void *)((long)buff + 0xe9d),"e + 157","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xe9d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ŏ',(void *)((long)buff + 0xf01),"e + 257","ustar","\"ustar\\000000\"",8,
                      "8",(void *)0x0);
  *(undefined8 *)((long)buff + 0xf01) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ő',(void *)((long)buff + 0xf09),"e + 265","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xf09) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ő',(void *)((long)buff + 0xf29),"e + 297","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xf29) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Œ',(void *)((long)buff + 0xf49),"e + 329","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0xf49) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'œ',(void *)((long)buff + 0xf51),"e + 337","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0xf51) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ŕ',(void *)((long)buff + 0xf59),"e + 345",f256,"f256",0x9b,"155",
                      (void *)0x0);
  memset((void *)((long)buff + 0xf59),0,0x9b);
  lVar6 = 0xe00;
  do {
    if (*(char *)((long)buff + lVar6) != '\0') goto LAB_002022e8;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x1000);
  wVar7 = L'\x01';
LAB_002022e8:
  wVar8 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'ŕ',wVar7,"is_null(e + 0, 512)",(void *)0x0);
  lVar6 = -0x400;
  do {
    if (*(char *)((long)buff + lVar6 + 0x1400) != '\0') goto LAB_00202325;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0);
  wVar8 = L'\x01';
LAB_00202325:
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'ś',wVar8,"is_null(e, 1024)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ş',(long)(int)used,"(int)used",0x1400,"e - buff",(void *)0x0);
  free(buff);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_tar_ustar)
{
	struct archive *a;
	struct archive_entry *entry;
	char *buff, *e;
	size_t buffsize = 100000;
	size_t used;
	int i;
	char f99[100];
	char f100[101];
	char f256[257];

	for (i = 0; i < 99; ++i)
		f99[i] = 'a' + i % 26;
	f99[99] = '\0';

	for (i = 0; i < 100; ++i)
		f100[i] = 'A' + i % 26;
	f100[100] = '\0';

	for (i = 0; i < 256; ++i)
		f256[i] = 'A' + i % 26;
	f256[155] = '/';
	f256[256] = '\0';

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * Add various files to it.
	 * TODO: Extend this to cover more filetypes.
	 */

	/* "file" with 10 bytes of content */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, "file");
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 10);
	archive_entry_set_uid(entry, 80);
	archive_entry_set_gid(entry, 90);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 89);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualIntA(a, 10, archive_write_data(a, "1234567890", 10));

	/* Hardlink to "file" with 10 bytes of content */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, "linkfile");
	archive_entry_set_mode(entry, S_IFREG | 0664);
	/* TODO: Put this back and fix the bug. */
	/* archive_entry_set_size(entry, 10); */
	archive_entry_set_uid(entry, 80);
	archive_entry_set_gid(entry, 90);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 89);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);
	/* Write of data to dir should fail == zero bytes get written. */
	assertEqualIntA(a, 0, archive_write_data(a, "1234567890", 10));

	/* "dir" */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 2, 20);
	archive_entry_set_pathname(entry, "dir");
	archive_entry_set_mode(entry, S_IFDIR | 0775);
	archive_entry_set_size(entry, 10);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);
	/* Write of data to dir should fail == zero bytes get written. */
	assertEqualIntA(a, 0, archive_write_data(a, "1234567890", 10));

	/* "symlink" pointing to "file" */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 3, 30);
	archive_entry_set_pathname(entry, "symlink");
	archive_entry_set_mode(entry, 0664);
	archive_entry_set_filetype(entry, AE_IFLNK);
	archive_entry_set_symlink(entry,"file");
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 88);
	archive_entry_set_gid(entry, 98);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 90);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);
	/* Write of data to symlink should fail == zero bytes get written. */
	assertEqualIntA(a, 0, archive_write_data(a, "1234567890", 10));

	/* file with 99-char filename. */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, f99);
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 82);
	archive_entry_set_gid(entry, 93);
	archive_entry_set_dev(entry, 102);
	archive_entry_set_ino(entry, 7);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);

	/* file with 100-char filename. */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, f100);
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 82);
	archive_entry_set_gid(entry, 93);
	archive_entry_set_dev(entry, 102);
	archive_entry_set_ino(entry, 7);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);

	/* file with 256-char filename. */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, f256);
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 82);
	archive_entry_set_gid(entry, 93);
	archive_entry_set_dev(entry, 102);
	archive_entry_set_ino(entry, 7);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);

	/* Close out the archive. */
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Verify the archive format.
	 */
	e = buff;

	/* "file" */
	myAssertEqualMem(e + 0, "file", 5); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000120 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000132 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000012 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "010034\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	myAssertEqualMem(e + 512, "1234567890", 10);
	assert(is_null(e + 512, 512));
	e += 1024;

	/* hardlink to "file" */
	myAssertEqualMem(e + 0, "linkfile", 9); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000120 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000132 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "010707\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* "dir" */
	myAssertEqualMem(e + 0, "dir/", 4); /* Filename */
	myAssertEqualMem(e + 100, "000775 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000000 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000000 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000002 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "007747\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "5", 1); /* typeflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* "symlink" pointing to "file" */
	myAssertEqualMem(e + 0, "symlink", 8); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000130 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000142 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000003 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "011446\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "2", 1); /* linkflag */
	myAssertEqualMem(e + 157, "file", 5); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* File with 99-char filename */
	myAssertEqualMem(e + 0, f99, 100); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000122 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000135 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "034242\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* File with 100-char filename */
	myAssertEqualMem(e + 0, f100, 100); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000122 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000135 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "026230\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* File with 256-char filename */
	myAssertEqualMem(e + 0, f256 + 156, 100); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000122 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000135 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "055570\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, f256, 155); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* TODO: Verify other types of entries. */

	/* Last entry is end-of-archive marker. */
	assert(is_null(e, 1024));
	e += 1024;

	assertEqualInt((int)used, e - buff);

	free(buff);
}